

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)1,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,unsigned_short *eDI,unsigned_short *eAX,Context *context)

{
  type_conflict2 source;
  
  if (*eCX != 0) {
    source = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                       (&context->memory,ES,*eDI);
    *eDI = *eDI + (short)(context->flags).direction_ * 2;
    sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (*eAX,source,context);
    *eCX = *eCX - 1;
    if ((*eCX != 0) && ((context->flags).zero_ == 0)) {
      (context->flow_controller).should_repeat_ = true;
    }
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}